

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReader.h
# Opt level: O2

void __thiscall
anurbs::DataReader::fill_vector<Eigen::Matrix<double,1,3,1,1,3>>
          (DataReader *this,string *key,Matrix<double,_1,_3,_1,_1,_3> *vector)

{
  const_reference pvVar1;
  size_type sVar2;
  size_type sVar3;
  Scalar *pSVar4;
  Index i;
  double dVar5;
  value_type data;
  
  pvVar1 = nlohmann::
           basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at(this->m_data,key);
  nlohmann::
  basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&data,pvVar1);
  sVar2 = nlohmann::
          basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::size(&data);
  if (sVar2 == 3) {
    sVar2 = 0;
    while( true ) {
      sVar3 = nlohmann::
              basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::size(&data);
      if ((long)sVar3 <= (long)sVar2) break;
      pvVar1 = nlohmann::
               basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(&data,sVar2);
      dVar5 = nlohmann::
              basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::get<double,_double,_0>(pvVar1);
      pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)vector,sVar2);
      *pSVar4 = dVar5;
      sVar2 = sVar2 + 1;
    }
    nlohmann::
    basic_json<anurbs::FiFoMap,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&data);
    return;
  }
  __assert_fail("data.size() == vector.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/include/anurbs/Algorithm/../Geometry/../Model/DataReader.h"
                ,0x33,
                "void anurbs::DataReader::fill_vector(const std::string &, T) const [T = Eigen::Matrix<double, 1, 3>]"
               );
}

Assistant:

void fill_vector(const std::string& key, T vector) const
    {
        const auto data = m_data.at(key);
        
        assert(data.size() == vector.size());

        for (Index i = 0; i < length(data); i++) {
            vector[i] = data.at(i);
        }
    }